

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseCompiler::addInvokeNode
          (BaseCompiler *this,InvokeNode **out,InstId instId,Operand_ *o0,FuncSignature *signature)

{
  uint uVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  BaseCompiler *in_RSI;
  State *in_RDI;
  Operand_ *in_R8;
  Error _err;
  State state;
  uint in_stack_ffffffffffffff50;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  BaseBuilder *this_00;
  undefined4 in_stack_ffffffffffffff80;
  Error local_64;
  undefined4 local_2c;
  char **local_28;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 *local_10;
  char **local_8;
  
  uVar1 = *(uint *)&in_RDI[3].field_0xc | *(uint *)&in_RDI[1].field_0xc;
  uVar2 = SUB84(in_RDI[3].comment,0);
  uVar3 = (undefined4)((ulong)in_RDI[3].comment >> 0x20);
  this_00 = *(BaseBuilder **)(in_RDI + 4);
  *(undefined4 *)&in_RDI[3].field_0xc = 0;
  local_28 = &in_RDI[3].comment;
  local_1c = 0;
  local_18 = 0;
  local_2c = 0;
  local_10 = &local_2c;
  local_14 = 0;
  *(undefined4 *)local_28 = 0;
  *(undefined4 *)((long)&in_RDI[3].comment + 4) = 0;
  in_RDI[4].options = kNone;
  in_RDI[4].extraReg._signature = 0;
  local_8 = local_28;
  local_64 = newInvokeNode(in_RSI,(InvokeNode **)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
                           (InstId)((ulong)in_RCX >> 0x20),in_R8,(FuncSignature *)this_00);
  if (local_64 == 0) {
    BaseBuilder_assignInstState
              ((BaseBuilder *)CONCAT44(uVar2,uVar1),(InstNode *)(ulong)in_stack_ffffffffffffff50,
               in_RDI);
    BaseBuilder::addNode(this_00,(BaseNode *)CONCAT44(in_stack_ffffffffffffff64,uVar3));
    local_64 = 0;
  }
  return local_64;
}

Assistant:

Error BaseCompiler::addInvokeNode(InvokeNode** out, InstId instId, const Operand_& o0, const FuncSignature& signature) {
  State state = _grabState();

  ASMJIT_PROPAGATE(newInvokeNode(out, instId, o0, signature));
  ASMJIT_ASSUME(*out != nullptr);

  BaseBuilder_assignInstState(this, *out, state);
  addNode(*out);
  return kErrorOk;
}